

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualSuceedsOnEqual::~TestCheckArrayEqualSuceedsOnEqual
          (TestCheckArrayEqualSuceedsOnEqual *this)

{
  TestCheckArrayEqualSuceedsOnEqual *this_local;
  
  ~TestCheckArrayEqualSuceedsOnEqual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayEqualSuceedsOnEqual)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[4] = { 0, 1, 2, 3 };
        CHECK_ARRAY_EQUAL (data, data, 4);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}